

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void * xemmai::t_heap<xemmai::t_object>::f_map(size_t a_n)

{
  void *pvVar1;
  void *p;
  size_t a_n_local;
  
  pvVar1 = mmap((void *)0x0,a_n,3,0x22,-1,0);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    xemmai::portable::f_throw_system_error();
  }
  return pvVar1;
}

Assistant:

static void* f_map(size_t a_n)
	{
#ifdef __unix__
		auto p = mmap(NULL, a_n, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
		if (p == MAP_FAILED) portable::f_throw_system_error();
#endif
#ifdef _WIN32
		auto p = VirtualAlloc(NULL, a_n, MEM_COMMIT | MEM_RESERVE, PAGE_READWRITE);
		if (p == NULL) throw std::system_error(GetLastError(), std::system_category());
#endif
		return p;
	}